

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void nn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  int iVar1;
  pointer pbVar2;
  element_type *__nptr;
  pointer pcVar3;
  int iVar4;
  int *piVar5;
  istream *piVar6;
  long lVar7;
  string prompt;
  string queryWord;
  FastText fasttext;
  string local_100;
  string local_e0;
  FastText local_c0;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
  if (lVar7 != 3) {
    if (lVar7 != 4) {
      printNNUsage();
      exit(1);
    }
    __nptr = (element_type *)pbVar2[3]._M_dataplus._M_p;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar7 = strtol((char *)__nptr,(char **)&local_c0,10);
    if (local_c0.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        __nptr) {
      iVar4 = *piVar5;
      if ((int)lVar7 != lVar7 || iVar4 == 0x22) {
        iVar4 = std::__throw_out_of_range("stoi");
      }
      if (iVar4 == 0) {
        *piVar5 = iVar1;
      }
      goto LAB_0012d997;
    }
    std::__throw_invalid_argument("stoi");
  }
  lVar7 = 10;
LAB_0012d997:
  ::fasttext::FastText::FastText(&local_c0);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  ::fasttext::FastText::loadModel(&local_c0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Query word? ","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_100._M_dataplus._M_p,local_100._M_string_length);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar6 = std::operator>>((istream *)&std::cin,(string *)&local_e0);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    ::fasttext::FastText::getNN(&local_48,&local_c0,&local_e0,(int32_t)lVar7);
    printPredictions(&local_48,true,true);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_100._M_dataplus._M_p,local_100._M_string_length);
  }
  exit(0);
}

Assistant:

void nn(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printNNUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string prompt("Query word? ");
  std::cout << prompt;

  std::string queryWord;
  while (std::cin >> queryWord) {
    printPredictions(fasttext.getNN(queryWord, k), true, true);
    std::cout << prompt;
  }
  exit(0);
}